

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSourceDefaultInstance
          (FileGenerator *this,int idx,Printer *printer)

{
  Options *descriptor;
  string *args_1;
  MessageGenerator *this_00;
  Options *pOVar1;
  Formatter format;
  string sStack_a8;
  string local_88;
  Formatter local_68;
  
  local_68.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_68.vars_._M_t,&(this->variables_)._M_t);
  pOVar1 = (Options *)
           (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (MessageGenerator *)(&(pOVar1->dllexport_decl)._M_dataplus)[idx]._M_p;
  descriptor = &this->options_;
  DefaultInstanceType_abi_cxx11_
            (&sStack_a8,(cpp *)this_00->descriptor_,(Descriptor *)descriptor,pOVar1);
  args_1 = &this_00->classname_;
  pOVar1 = (Options *)args_1;
  Formatter::operator()
            (&local_68,
             "class $1$ {\n public:\n  ::$proto_ns$::internal::ExplicitlyConstructed<$2$> _instance;\n"
             ,&sStack_a8,args_1);
  std::__cxx11::string::~string((string *)&sStack_a8);
  io::Printer::Indent(local_68.printer_);
  MessageGenerator::GenerateExtraDefaultFields(this_00,printer);
  io::Printer::Outdent(local_68.printer_);
  DefaultInstanceName_abi_cxx11_
            (&sStack_a8,(cpp *)this_00->descriptor_,(Descriptor *)descriptor,pOVar1);
  Formatter::operator()(&local_68,"} $1$;\n",&sStack_a8);
  std::__cxx11::string::~string((string *)&sStack_a8);
  if ((this->options_).lite_implicit_weak_fields == true) {
    DefaultInstancePtr_abi_cxx11_
              (&sStack_a8,(cpp *)this_00->descriptor_,(Descriptor *)descriptor,pOVar1);
    DefaultInstanceName_abi_cxx11_
              (&local_88,(cpp *)this_00->descriptor_,(Descriptor *)descriptor,pOVar1);
    Formatter::operator()
              (&local_68,"$1$DefaultTypeInternal* $2$ = &$3$;\n",args_1,&sStack_a8,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&sStack_a8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_68.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateSourceDefaultInstance(int idx,
                                                  io::Printer* printer) {
  Formatter format(printer, variables_);
  MessageGenerator* generator = message_generators_[idx].get();
  format(
      "class $1$ {\n"
      " public:\n"
      "  ::$proto_ns$::internal::ExplicitlyConstructed<$2$> _instance;\n",
      DefaultInstanceType(generator->descriptor_, options_),
      generator->classname_);
  format.Indent();
  generator->GenerateExtraDefaultFields(printer);
  format.Outdent();
  format("} $1$;\n", DefaultInstanceName(generator->descriptor_, options_));
  if (options_.lite_implicit_weak_fields) {
    format("$1$DefaultTypeInternal* $2$ = &$3$;\n", generator->classname_,
           DefaultInstancePtr(generator->descriptor_, options_),
           DefaultInstanceName(generator->descriptor_, options_));
  }
}